

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O2

string * license::test::sign_data(string *__return_storage_ptr__,string *data,string *test_name)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int retCode;
  string output_file_s;
  path outputFile;
  undefined4 local_494;
  path licenses_base;
  path lcc_exe;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  ifstream ifs;
  undefined8 auStack_2d8 [36];
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1a8 [23];
  
  boost::filesystem::path::path
            (&lcc_exe,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/build_O2/extern/license-generator/src/license_generator/lccgen"
            );
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/generate-license.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x3f);
  ss = (stringstream)boost::filesystem::is_regular_file(&lcc_exe);
  aaStack_1a8[0]._M_allocated_capacity = 0;
  _ifs = &PTR__lazy_ostream_0056bdc0;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/generate-license.cpp"
  ;
  local_3e8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&aaStack_1a8[0]._M_allocated_capacity);
  boost::filesystem::path::path
            (&licenses_base,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/build_O2/Testing/Temporary/DEFAULT/licenses"
            );
  bVar2 = boost::filesystem::exists(&licenses_base);
  if (!bVar2) {
    local_400 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/generate-license.cpp"
    ;
    local_3f8 = "";
    local_410 = &boost::unit_test::basic_cstring<char_const>::null;
    local_408 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x42);
    outputFile.m_pathname._M_dataplus._M_p._0_1_ =
         boost::filesystem::create_directories(&licenses_base);
    outputFile.m_pathname._M_string_length = 0;
    outputFile.m_pathname.field_2._M_allocated_capacity = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   "test folders created ",&licenses_base.m_pathname);
    _ifs = &PTR__lazy_ostream_0056be00;
    local_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/generate-license.cpp"
    ;
    local_418 = "";
    boost::test_tools::tt_detail::report_assertion(&outputFile,&ifs,&local_420,0x42,2,1,0);
    std::__cxx11::string::~string((string *)&ss);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&outputFile.m_pathname.field_2._M_allocated_capacity);
  }
  boost::filesystem::path::path
            ((path *)&ifs,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/build_O2/Testing/Temporary"
            );
  std::operator+(&output_file_s,test_name,".tmp");
  std::__cxx11::string::string((string *)&ss,(string *)&output_file_s);
  boost::filesystem::operator/(&outputFile,(path *)&ifs,(path *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&output_file_s);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string((string *)&output_file_s,(string *)&outputFile);
  remove(output_file_s._M_dataplus._M_p);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<((ostream *)aaStack_1a8[0]._M_local_buf,
                           "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/build_O2/extern/license-generator/src/license_generator/lccgen"
                          );
  std::operator<<(poVar4," test sign");
  poVar4 = std::operator<<((ostream *)aaStack_1a8[0]._M_local_buf," --primary-key ");
  std::operator<<(poVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/projects/DEFAULT/private_key.rsa"
                 );
  poVar4 = std::operator<<((ostream *)aaStack_1a8[0]._M_local_buf," -d ");
  std::operator<<(poVar4,(string *)data);
  poVar4 = std::operator<<((ostream *)aaStack_1a8[0]._M_local_buf," -o ");
  std::operator<<(poVar4,(string *)&output_file_s);
  poVar4 = std::operator<<((ostream *)std::cout,"executing :");
  std::__cxx11::stringbuf::str();
  poVar4 = std::operator<<(poVar4,(string *)&ifs);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::stringbuf::str();
  iVar3 = system((char *)_ifs);
  std::__cxx11::string::~string((string *)&ifs);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/generate-license.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  retCode = iVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x51);
  _ifs = &PTR__lazy_ostream_0056b6a0;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/generate-license.cpp"
  ;
  local_448 = "";
  local_494 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&ifs,&local_450,0x51,1,2,&retCode,"retCode",&local_494,"0");
  bVar2 = boost::filesystem::exists(&outputFile);
  if (bVar2) {
    std::ifstream::ifstream(&ifs,output_file_s._M_dataplus._M_p,_S_in);
    uVar1 = *(undefined8 *)((long)auStack_2d8 + (long)_ifs[-3]);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,uVar1,0xffffffffffffffff,0,0xffffffff);
    std::ifstream::~ifstream(&ifs);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::__cxx11::string::~string((string *)&output_file_s);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&licenses_base);
    std::__cxx11::string::~string((string *)&lcc_exe);
    return __return_storage_ptr__;
  }
  __assert_fail("fs::exists(outputFile)",
                "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/generate-license.cpp"
                ,0x52,"string license::test::sign_data(const string &, const string &)");
}

Assistant:

string sign_data(const string& data, const string& test_name) {
	fs::path lcc_exe(LCC_EXE);
	BOOST_REQUIRE_MESSAGE(fs::is_regular_file(lcc_exe), "License generator not found: " LCC_EXE);
	fs::path licenses_base(LCC_LICENSES_BASE);
	if (!fs::exists(licenses_base)) {
		BOOST_REQUIRE_MESSAGE(fs::create_directories(licenses_base), "test folders created " + licenses_base.string());
	}

	const fs::path outputFile(fs::path(PROJECT_TEST_TEMP_DIR) / (test_name + ".tmp"));
	const string output_file_s = outputFile.string();
	remove(output_file_s.c_str());

	stringstream ss;
	ss << LCC_EXE << " test sign";
	ss << " --" PARAM_PRIMARY_KEY " " << LCC_PROJECT_PRIVATE_KEY;
	ss << " -d " << data;
	ss << " -o " << output_file_s;

	cout << "executing :" << ss.str() << endl;
	const int retCode = std::system(ss.str().c_str());
	BOOST_CHECK_EQUAL(retCode, 0);
	BOOST_ASSERT(fs::exists(outputFile));
	std::ifstream ifs(output_file_s.c_str());
	std::string content((std::istreambuf_iterator<char>(ifs)), (std::istreambuf_iterator<char>()));
	return content;
}